

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::combineDataTypes
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          bool enumerating,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataTypes,CommandFlavourFlags flavourFlags,bool raii)

{
  unsigned_long uVar1;
  size_t sVar2;
  const_iterator cVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  size_type sVar7;
  _Base_ptr p_Var8;
  const_reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  size_type sVar12;
  pointer ppVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  _Base_ptr local_3a0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_398;
  _Base_ptr local_390;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_388;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_380;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_2f0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  byte local_21b;
  byte local_21a;
  byte local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_198;
  undefined1 local_190;
  byte local_18f;
  byte local_18e;
  byte local_18d;
  byte local_18c;
  byte local_18b;
  byte local_18a;
  allocator<char> local_189;
  string local_188;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  byte local_103;
  allocator<char> local_102;
  CommandFlavourFlagBits local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  byte local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  CommandFlavourFlagBits local_b1;
  _Self local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Self local_88;
  const_iterator vectorParamIt;
  size_t i;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_61;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modifiedDataTypes;
  bool raii_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dataTypes_local;
  bool enumerating_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams_local;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *vectorParams_local;
  VulkanHppGenerator *this_local;
  string *psStack_10;
  CommandFlavourFlags flavourFlags_local;
  string *combinedType;
  
  this_local._7_1_ = flavourFlags.m_mask;
  modifiedDataTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = raii;
  psStack_10 = __return_storage_ptr__;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(dataTypes);
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(returnParams);
  if (sVar6 != sVar7) {
    __assert_fail("dataTypes.size() == returnParams.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x585,
                  "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                 );
  }
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(dataTypes);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60,sVar6,&local_61);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_61);
  vectorParamIt._M_node = (_Base_ptr)0x0;
  do {
    cVar3._M_node = vectorParamIt._M_node;
    p_Var8 = (_Base_ptr)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(returnParams);
    if (p_Var8 <= cVar3._M_node) {
      local_190 = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_60);
      switch(sVar6) {
      case 0:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,"void");
        break;
      case 1:
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_60,0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,pvVar11);
        break;
      case 2:
        bVar4 = true;
        if (enumerating) {
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (returnParams,1);
          bVar5 = std::
                  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  ::contains(vectorParams,pvVar9);
          bVar4 = false;
          if (bVar5) {
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (returnParams,1);
            local_198._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 ::find(vectorParams,pvVar9);
            ppVar13 = std::
                      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                      ::operator->(&local_198);
            sVar2 = (ppVar13->second).lenParam;
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (returnParams,0);
            bVar4 = sVar2 == *pvVar9;
          }
        }
        if (!bVar4) {
          __assert_fail("!enumerating || ( vectorParams.contains( returnParams[1] ) && ( vectorParams.find( returnParams[1] )->second.lenParam == returnParams[0] ) )"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x599,
                        "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                       );
        }
        local_219 = 0;
        local_21a = 0;
        local_21b = 0;
        if (enumerating) {
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_60,1);
          std::__cxx11::string::string((string *)&local_1b8,pvVar11);
        }
        else {
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_60,0);
          std::operator+(&local_218,"std::pair<",pvVar11);
          local_219 = 1;
          std::operator+(&local_1f8,&local_218,", ");
          local_21a = 1;
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_60,1);
          std::operator+(&local_1d8,&local_1f8,pvVar11);
          local_21b = 1;
          std::operator+(&local_1b8,&local_1d8,">");
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        if ((local_21b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1d8);
        }
        if ((local_21a & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1f8);
        }
        if ((local_219 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_218);
        }
        break;
      case 3:
        sVar12 = std::
                 map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 ::size(vectorParams);
        if (sVar12 == 0) {
          if (((enumerating ^ 0xffU) & 1) == 0) {
            __assert_fail("!enumerating",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x5a0,
                          "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                         );
          }
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_60,0);
          std::operator+(&local_2e0,"std::tuple<",pvVar11);
          std::operator+(&local_2c0,&local_2e0,", ");
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_60,1);
          std::operator+(&local_2a0,&local_2c0,pvVar11);
          std::operator+(&local_280,&local_2a0,", ");
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_60,2);
          std::operator+(&local_260,&local_280,pvVar11);
          std::operator+(&local_240,&local_260,">");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,&local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_2e0);
        }
        else if (sVar12 == 1) {
          if (!enumerating) {
            __assert_fail("enumerating",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x5a4,
                          "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                         );
          }
          local_2e8._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               ::begin(vectorParams);
          ppVar13 = std::
                    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                    ::operator->(&local_2e8);
          uVar1 = ppVar13->first;
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (returnParams,2);
          bVar4 = false;
          if (uVar1 == *pvVar9) {
            local_2f0._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 ::begin(vectorParams);
            ppVar13 = std::
                      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                      ::operator->(&local_2f0);
            sVar2 = (ppVar13->second).lenParam;
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (returnParams,1);
            bVar4 = sVar2 == *pvVar9;
          }
          if (!bVar4) {
            __assert_fail("( vectorParams.begin()->first == returnParams[2] ) && ( vectorParams.begin()->second.lenParam == returnParams[1] )"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x5a5,
                          "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                         );
          }
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_60,0);
          std::operator+(&local_370,"std::pair<",pvVar11);
          std::operator+(&local_350,&local_370,", ");
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_60,2);
          std::operator+(&local_330,&local_350,pvVar11);
          std::operator+(&local_310,&local_330,">");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,&local_310);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_370);
        }
        else {
          if (sVar12 != 2) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x5af,
                          "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                         );
          }
          if (!enumerating) {
            __assert_fail("enumerating",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x5a9,
                          "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                         );
          }
          local_378._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               ::begin(vectorParams);
          ppVar13 = std::
                    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                    ::operator->(&local_378);
          uVar1 = ppVar13->first;
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (returnParams,1);
          bVar4 = false;
          if (uVar1 == *pvVar9) {
            local_380._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 ::begin(vectorParams);
            ppVar13 = std::
                      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                      ::operator->(&local_380);
            sVar2 = (ppVar13->second).lenParam;
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (returnParams,0);
            bVar4 = false;
            if (sVar2 == *pvVar9) {
              local_390 = (_Base_ptr)
                          std::
                          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                          ::begin(vectorParams);
              local_388 = std::
                          next<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                                    ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                                      )local_390,1);
              ppVar13 = std::
                        _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                        ::operator->(&local_388);
              uVar1 = ppVar13->first;
              pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (returnParams,2);
              bVar4 = false;
              if (uVar1 == *pvVar9) {
                local_3a0 = (_Base_ptr)
                            std::
                            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                            ::begin(vectorParams);
                local_398 = std::
                            next<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                                      ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                                        )local_3a0,1);
                ppVar13 = std::
                          _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                          ::operator->(&local_398);
                sVar2 = (ppVar13->second).lenParam;
                pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (returnParams,0);
                bVar4 = sVar2 == *pvVar9;
              }
            }
          }
          if (!bVar4) {
            __assert_fail("( vectorParams.begin()->first == returnParams[1] ) && ( vectorParams.begin()->second.lenParam == returnParams[0] ) && ( std::next( vectorParams.begin() )->first == returnParams[2] ) && ( std::next( vectorParams.begin() )->second.lenParam == returnParams[0] )"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x5ac,
                          "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                         );
          }
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_60,1);
          std::operator+(&local_420,"std::pair<",pvVar11);
          std::operator+(&local_400,&local_420,", ");
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_60,2);
          std::operator+(&local_3e0,&local_400,pvVar11);
          std::operator+(&local_3c0,&local_3e0,">");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,&local_3c0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_400);
          std::__cxx11::string::~string((string *)&local_420);
        }
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5b2,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      local_190 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60);
      return __return_storage_ptr__;
    }
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (returnParams,(size_type)vectorParamIt._M_node);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
         ::find(vectorParams,pvVar9);
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
         ::end(vectorParams);
    bVar4 = std::operator==(&local_88,&local_b0);
    local_d9 = 0;
    local_103 = 0;
    local_18a = 0;
    local_18b = 0;
    local_18c = 0;
    local_18d = 0;
    local_18e = 0;
    local_18f = 0;
    if (bVar4) {
LAB_0013b96a:
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](dataTypes,(size_type)vectorParamIt._M_node);
      std::__cxx11::string::string((string *)&local_a8,pvVar10);
    }
    else {
      local_b1 = singular;
      bVar4 = Flags<CommandFlavourFlagBits>::operator&
                        ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),&local_b1);
      if (bVar4) goto LAB_0013b96a;
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](dataTypes,(size_type)vectorParamIt._M_node);
      std::operator+(&local_d8,"std::vector<",pvVar10);
      local_d9 = 1;
      if ((modifiedDataTypes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        local_101 = unique;
        bVar4 = Flags<CommandFlavourFlagBits>::operator&
                          ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),&local_101);
        if (bVar4) goto LAB_0013b9dc;
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](dataTypes,(size_type)vectorParamIt._M_node);
        std::allocator<char>::allocator();
        local_18a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"VULKAN_HPP_NAMESPACE::",&local_189);
        local_18b = 1;
        stripPrefix(&local_168,pvVar10,&local_188);
        local_18c = 1;
        anon_unknown.dwarf_b1723::startUpperCase(&local_148,&local_168);
        local_18d = 1;
        std::operator+(&local_128,", ",&local_148);
        local_18e = 1;
        std::operator+(&local_100,&local_128,"Allocator>");
      }
      else {
LAB_0013b9dc:
        std::allocator<char>::allocator();
        local_103 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,">",&local_102);
      }
      local_18f = 1;
      std::operator+(&local_a8,&local_d8,&local_100);
    }
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_60,(size_type)vectorParamIt._M_node);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pvVar11,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if ((local_18f & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_100);
    }
    if ((local_18e & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_128);
    }
    if ((local_18d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_148);
    }
    if ((local_18c & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_168);
    }
    if ((local_18b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_188);
    }
    if ((local_18a & 1) != 0) {
      std::allocator<char>::~allocator(&local_189);
    }
    if ((local_103 & 1) != 0) {
      std::allocator<char>::~allocator(&local_102);
    }
    if ((local_d9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_d8);
    }
    vectorParamIt._M_node = (_Base_ptr)((long)&(vectorParamIt._M_node)->_M_color + 1);
  } while( true );
}

Assistant:

std::string VulkanHppGenerator::combineDataTypes( std::map<size_t, VectorParamData> const & vectorParams,
                                                  std::vector<size_t> const &               returnParams,
                                                  bool                                      enumerating,
                                                  std::vector<std::string> const &          dataTypes,
                                                  CommandFlavourFlags                       flavourFlags,
                                                  bool                                      raii ) const
{
  assert( dataTypes.size() == returnParams.size() );

  std::vector<std::string> modifiedDataTypes( dataTypes.size() );
  for ( size_t i = 0; i < returnParams.size(); ++i )
  {
    auto vectorParamIt   = vectorParams.find( returnParams[i] );
    modifiedDataTypes[i] = ( vectorParamIt == vectorParams.end() || ( flavourFlags & CommandFlavourFlagBits::singular ) )
                           ? dataTypes[i]
                           : ( "std::vector<" + dataTypes[i] +
                               ( raii || ( flavourFlags & CommandFlavourFlagBits::unique )
                                   ? ">"
                                   : ( ", " + startUpperCase( stripPrefix( dataTypes[i], "VULKAN_HPP_NAMESPACE::" ) ) + "Allocator>" ) ) );
  }

  std::string combinedType;
  switch ( modifiedDataTypes.size() )
  {
    case 0: combinedType = "void"; break;
    case 1: combinedType = modifiedDataTypes[0]; break;
    case 2:
      assert( !enumerating || ( vectorParams.contains( returnParams[1] ) && ( vectorParams.find( returnParams[1] )->second.lenParam == returnParams[0] ) ) );
      combinedType = enumerating ? modifiedDataTypes[1] : ( "std::pair<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[1] + ">" );
      break;
    case 3:
      switch ( vectorParams.size() )
      {
        case 0:
          assert( !enumerating );
          combinedType = "std::tuple<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[1] + ", " + modifiedDataTypes[2] + ">";
          break;
        case 1:
          assert( enumerating );
          assert( ( vectorParams.begin()->first == returnParams[2] ) && ( vectorParams.begin()->second.lenParam == returnParams[1] ) );
          combinedType = "std::pair<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[2] + ">";
          break;
        case 2:
          assert( enumerating );
          assert( ( vectorParams.begin()->first == returnParams[1] ) && ( vectorParams.begin()->second.lenParam == returnParams[0] ) &&
                  ( std::next( vectorParams.begin() )->first == returnParams[2] ) &&
                  ( std::next( vectorParams.begin() )->second.lenParam == returnParams[0] ) );
          combinedType = "std::pair<" + modifiedDataTypes[1] + ", " + modifiedDataTypes[2] + ">";
          break;
        default: assert( false ); break;
      }
      break;
    default: assert( false ); break;
  }
  return combinedType;
}